

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::objectivec::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FieldDescriptor *field)

{
  objectivec oVar1;
  __uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  this_00;
  __uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  _Var2;
  undefined8 in_RAX;
  EnumValueDescriptor *this_01;
  Nonnull<const_char_*> pcVar3;
  undefined8 extraout_RAX;
  bool v1;
  ulong uVar4;
  undefined7 uVar5;
  Nonnull<char_*> pcVar6;
  EnumValueDescriptor *descriptor;
  char *buffer;
  size_type in_R9;
  pointer unaff_R12;
  string_view src;
  string_view s;
  string_view src_00;
  string_view s_00;
  FixedMapping replacements;
  FixedMapping replacements_00;
  string bytes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138;
  undefined1 local_118 [48];
  string local_e8;
  string local_c8;
  string local_a8;
  AlphaNum local_88;
  undefined1 local_58 [48];
  
  oVar1 = this[1];
  uVar4 = CONCAT71((int7)((ulong)in_RAX >> 8),oVar1) & 0xffffff20;
  uVar5 = (undefined7)(uVar4 >> 8);
  v1 = (bool)((byte)uVar4 >> 5);
  if (0xbf < (byte)oVar1 == v1) {
    pcVar3 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (v1,0xbf < (byte)oVar1,
                        "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar3 != (Nonnull<const_char_*>)0x0) {
    DefaultValue_abi_cxx11_();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if (local_158._M_dataplus._M_p != unaff_R12) {
      operator_delete(local_158._M_dataplus._M_p,
                      CONCAT44(local_158.field_2._M_allocated_capacity._4_4_,
                               local_158.field_2._M_allocated_capacity._0_4_) + 1);
    }
    _Unwind_Resume(extraout_RAX);
  }
  oVar1 = this[1];
  src_00._M_str = (AlphaNum *)CONCAT71(uVar5,oVar1);
  if (((byte)oVar1 & 0x20) != 0) goto switchD_002c793f_caseD_a;
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)this[2] * 4)) {
  case 1:
    buffer = local_118 + 0x10;
    pcVar6 = absl::lts_20250127::numbers_internal::FastIntToBuffer(*(int32_t *)(this + 0x50),buffer)
    ;
    local_118._0_8_ = (long)pcVar6 - (long)buffer;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    local_118._8_8_ = buffer;
    goto LAB_002c7b20;
  case 2:
    pcVar6 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                       (*(int64_t *)(this + 0x50),local_118 + 0x10);
    local_118._0_8_ = (long)pcVar6 - (long)(local_118 + 0x10);
    local_88.piece_._M_len = 2;
    local_88.piece_._M_str = "LL";
    break;
  case 3:
    pcVar6 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                       (*(uint32_t *)(this + 0x50),local_118 + 0x10);
    local_118._0_8_ = (long)pcVar6 - (long)(local_118 + 0x10);
    local_88.piece_._M_len = 1;
    local_88.piece_._M_str = "U";
    break;
  case 4:
    pcVar6 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                       (*(uint64_t *)(this + 0x50),local_118 + 0x10);
    local_118._0_8_ = (long)pcVar6 - (long)(local_118 + 0x10);
    local_88.piece_._M_len = 3;
    local_88.piece_._M_str = "ULL";
    break;
  case 5:
    io::SimpleDtoa_abi_cxx11_
              (&local_a8,(io *)&switchD_002c793f::switchdataD_006012c4,*(double *)(this + 0x50));
    anon_unknown_0::HandleExtremeFloatingPoint(__return_storage_ptr__,&local_a8,false);
    local_138.field_2._M_allocated_capacity = local_a8.field_2._M_allocated_capacity;
    local_138._M_dataplus._M_p = local_a8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_002c7c2c;
  case 6:
    io::SimpleFtoa_abi_cxx11_
              (&local_c8,(io *)&switchD_002c793f::switchdataD_006012c4,*(float *)(this + 0x50));
    anon_unknown_0::HandleExtremeFloatingPoint(__return_storage_ptr__,&local_c8,true);
    local_138.field_2._M_allocated_capacity = local_c8.field_2._M_allocated_capacity;
    local_138._M_dataplus._M_p = local_c8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p == &local_c8.field_2) {
      return __return_storage_ptr__;
    }
LAB_002c7c2c:
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    return __return_storage_ptr__;
  case 7:
    oVar1 = this[0x50];
    buffer = "NO";
    if ((ulong)(byte)oVar1 != 0) {
      buffer = "YES";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = (Nonnull<char_*>)
             ((long)&(((LogMessageData *)buffer)->entry).full_filename_._M_len +
             (ulong)(byte)oVar1 + 2);
    goto LAB_002c7b20;
  case 8:
    this_01 = FieldDescriptor::default_value_enum((FieldDescriptor *)this);
    EnumValueName_abi_cxx11_(__return_storage_ptr__,(objectivec *)this_01,descriptor);
    return __return_storage_ptr__;
  case 9:
    this_00._M_t.
    super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
    _M_head_impl = (*(__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                      **)(this + 0x50))[1]._M_t;
    if (((byte)oVar1 &
        (_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )this_00._M_t.
          super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
          .
          super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
          ._M_head_impl != (LogMessageData *)0x0) != 0) {
      _Var2._M_t.
      super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
      .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
      _M_head_impl = (*(__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                        **)(this + 0x50))->_M_t;
      if (this[2] == (objectivec)0xc) {
        local_158.field_2._M_allocated_capacity._0_4_ =
             ghtonl((uint32_t)
                    this_00._M_t.
                    super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                    .
                    super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                    ._M_head_impl);
        local_158._M_string_length = 4;
        local_158.field_2._M_allocated_capacity._4_4_ =
             local_158.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        local_118._0_8_ =
             this_00._M_t.
             super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             .
             super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
             ._M_head_impl;
        local_118._8_8_ = _Var2;
        absl::lts_20250127::StrAppend(&local_158,(AlphaNum *)local_118);
        local_118._0_8_ = 10;
        local_118._8_8_ = "(NSData*)\"";
        src._M_str = (char *)src_00._M_str;
        src._M_len = (size_t)local_158._M_dataplus._M_p;
        absl::lts_20250127::CEscape_abi_cxx11_
                  (&local_e8,(lts_20250127 *)local_158._M_string_length,src);
        local_58._0_8_ = 1;
        local_58._8_8_ = "?";
        local_58[0x10] = '\x02';
        local_58[0x11] = '\0';
        local_58[0x12] = '\0';
        local_58[0x13] = '\0';
        local_58[0x14] = '\0';
        local_58[0x15] = '\0';
        local_58[0x16] = '\0';
        local_58[0x17] = '\0';
        local_58._24_8_ = "\\?";
        s._M_str = local_58;
        s._M_len = (size_t)local_e8._M_dataplus._M_p;
        replacements._M_len = in_R9;
        replacements._M_array = (iterator)0x1;
        src_00._M_str = (AlphaNum *)0x1;
        absl::lts_20250127::StrReplaceAll_abi_cxx11_
                  (&local_138,(lts_20250127 *)local_e8._M_string_length,s,replacements);
        local_88.piece_._M_len = local_138._M_string_length;
        local_88.piece_._M_str = local_138._M_dataplus._M_p;
        local_58._0_8_ = 1;
        local_58._8_8_ = "\"";
        absl::lts_20250127::StrCat_abi_cxx11_
                  (__return_storage_ptr__,(lts_20250127 *)local_118,&local_88,(AlphaNum *)local_58,
                   src_00._M_str);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p == &local_158.field_2) {
          return __return_storage_ptr__;
        }
        local_138.field_2._M_allocated_capacity =
             CONCAT44(local_158.field_2._M_allocated_capacity._4_4_,
                      local_158.field_2._M_allocated_capacity._0_4_);
        local_138._M_dataplus._M_p = local_158._M_dataplus._M_p;
      }
      else {
        local_118._0_8_ = 2;
        local_118._8_8_ = "@\"";
        src_00._M_len =
             (size_t)_Var2._M_t.
                     super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                     .
                     super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                     ._M_head_impl;
        absl::lts_20250127::CEscape_abi_cxx11_
                  (&local_138,
                   (lts_20250127 *)
                   this_00._M_t.
                   super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                   .
                   super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                   ._M_head_impl,src_00);
        local_58._0_8_ = 1;
        local_58._8_8_ = "?";
        local_58[0x10] = '\x02';
        local_58[0x11] = '\0';
        local_58[0x12] = '\0';
        local_58[0x13] = '\0';
        local_58[0x14] = '\0';
        local_58[0x15] = '\0';
        local_58[0x16] = '\0';
        local_58[0x17] = '\0';
        local_58._24_8_ = "\\?";
        s_00._M_str = local_58;
        s_00._M_len = (size_t)local_138._M_dataplus._M_p;
        replacements_00._M_len = in_R9;
        replacements_00._M_array = (iterator)0x1;
        src_00._M_str = (AlphaNum *)0x1;
        absl::lts_20250127::StrReplaceAll_abi_cxx11_
                  (&local_158,(lts_20250127 *)local_138._M_string_length,s_00,replacements_00);
        local_88.piece_._M_len = local_158._M_string_length;
        local_88.piece_._M_str = local_158._M_dataplus._M_p;
        local_58._0_8_ = 1;
        local_58._8_8_ = "\"";
        absl::lts_20250127::StrCat_abi_cxx11_
                  (__return_storage_ptr__,(lts_20250127 *)local_118,&local_88,(AlphaNum *)local_58,
                   src_00._M_str);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,
                          CONCAT44(local_158.field_2._M_allocated_capacity._4_4_,
                                   local_158.field_2._M_allocated_capacity._0_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p == &local_138.field_2) {
          return __return_storage_ptr__;
        }
      }
      goto LAB_002c7c2c;
    }
  case 10:
switchD_002c793f_caseD_a:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    buffer = "nil";
    pcVar6 = "";
LAB_002c7b20:
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,buffer,pcVar6);
    return __return_storage_ptr__;
  default:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_118,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/helpers.cc"
               ,0x131);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              ((LogMessage *)local_118,(char (*) [16])"Can\'t get here.");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)local_118);
  }
  local_118._8_8_ = (long)local_118 + 0x10;
  absl::lts_20250127::StrCat_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)local_118,&local_88,src_00._M_str);
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultValue(const FieldDescriptor* field) {
  // Repeated fields don't have defaults.
  if (field->is_repeated()) {
    return "nil";
  }

  // Switch on cpp_type since we need to know which default_value_* method
  // of FieldDescriptor to call.
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      // gcc and llvm reject the decimal form of kint32min and kint64min.
      if (field->default_value_int32() == INT_MIN) {
        return "-0x80000000";
      }
      return absl::StrCat(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      return absl::StrCat(field->default_value_uint32(), "U");
    case FieldDescriptor::CPPTYPE_INT64:
      // gcc and llvm reject the decimal form of kint32min and kint64min.
      if (field->default_value_int64() == LLONG_MIN) {
        return "-0x8000000000000000LL";
      }
      return absl::StrCat(field->default_value_int64(), "LL");
    case FieldDescriptor::CPPTYPE_UINT64:
      return absl::StrCat(field->default_value_uint64(), "ULL");
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return HandleExtremeFloatingPoint(
          io::SimpleDtoa(field->default_value_double()), false);
    case FieldDescriptor::CPPTYPE_FLOAT:
      return HandleExtremeFloatingPoint(
          io::SimpleFtoa(field->default_value_float()), true);
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "YES" : "NO";
    case FieldDescriptor::CPPTYPE_STRING: {
      const bool has_default_value = field->has_default_value();
      absl::string_view default_string = field->default_value_string();
      if (!has_default_value || default_string.empty()) {
        // If the field is defined as being the empty string,
        // then we will just assign to nil, as the empty string is the
        // default for both strings and data.
        return "nil";
      }
      if (field->type() == FieldDescriptor::TYPE_BYTES) {
        // We want constant fields in our data structures so we can
        // declare them as static. To achieve this we cheat and stuff
        // a escaped c string (prefixed with a length) into the data
        // field, and cast it to an (NSData*) so it will compile.
        // The runtime library knows how to handle it.

        // Must convert to a standard byte order for packing length into
        // a cstring.
        uint32_t length = ghtonl((uint32_t)default_string.length());
        std::string bytes((const char*)&length, sizeof(length));
        absl::StrAppend(&bytes, default_string);
        return absl::StrCat("(NSData*)\"",
                            EscapeTrigraphs(absl::CEscape(bytes)), "\"");
      } else {
        return absl::StrCat(
            "@\"", EscapeTrigraphs(absl::CEscape(default_string)), "\"");
      }
    }
    case FieldDescriptor::CPPTYPE_ENUM:
      return EnumValueName(field->default_value_enum());
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return "nil";
  }

  // Some compilers report reaching end of function even though all cases of
  // the enum are handed in the switch.
  ABSL_LOG(FATAL) << "Can't get here.";
  return std::string();
}